

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::SpirVAssembly::createSpecConstantTests(TestContext *testCtx)

{
  char *pcVar1;
  TestCaseGroup *pTVar2;
  size_type sVar3;
  reference pvVar4;
  mapped_type *pmVar5;
  RGBA *local_1910;
  RGBA *local_18f8;
  RGBA *local_18e0;
  RGBA *local_18c8;
  string local_18b8;
  allocator<char> local_1891;
  string local_1890;
  value_type_conflict1 local_1870 [3];
  allocator<char> local_1861;
  key_type local_1860;
  allocator<char> local_1839;
  key_type local_1838;
  allocator<char> local_1811;
  key_type local_1810;
  undefined1 local_17f0 [8];
  vector<int,_std::allocator<int>_> specConstants;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  char function2 [442];
  char typesAndConstants2 [1402];
  char cStack_1066;
  char cStack_1065;
  char cStack_1064;
  char cStack_1063;
  char cStack_1062;
  char cStack_1061;
  char decorations2 [82];
  allocator<char> local_fe9;
  string local_fe8;
  allocator<char> local_fc1;
  key_type local_fc0;
  allocator<char> local_f99;
  string local_f98;
  StringTemplate local_f78;
  string local_f58;
  allocator<char> local_f31;
  key_type local_f30;
  allocator<char> local_f09;
  string local_f08;
  StringTemplate local_ee8;
  string local_ec8;
  allocator<char> local_ea1;
  key_type local_ea0;
  allocator<char> local_e79;
  string local_e78;
  StringTemplate local_e58;
  string local_e38;
  allocator<char> local_e11;
  key_type local_e10;
  allocator<char> local_de9;
  key_type local_de8;
  allocator<char> local_dc1;
  key_type local_dc0;
  allocator<char> local_d99;
  key_type local_d98;
  allocator<char> local_d71;
  key_type local_d70;
  undefined1 local_d50 [8];
  vector<int,_std::allocator<int>_> specConstants_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  specializations;
  size_t caseNdx;
  SpecConstantTwoIntGraphicsCase local_c88;
  SpecConstantTwoIntGraphicsCase local_c40;
  SpecConstantTwoIntGraphicsCase local_bf8;
  SpecConstantTwoIntGraphicsCase local_bb0;
  SpecConstantTwoIntGraphicsCase local_b68;
  SpecConstantTwoIntGraphicsCase local_b20;
  SpecConstantTwoIntGraphicsCase local_ad8;
  SpecConstantTwoIntGraphicsCase local_a90;
  SpecConstantTwoIntGraphicsCase local_a48;
  SpecConstantTwoIntGraphicsCase local_a00;
  SpecConstantTwoIntGraphicsCase local_9b8;
  SpecConstantTwoIntGraphicsCase local_970;
  SpecConstantTwoIntGraphicsCase local_928;
  SpecConstantTwoIntGraphicsCase local_8e0;
  SpecConstantTwoIntGraphicsCase local_898;
  SpecConstantTwoIntGraphicsCase local_850;
  SpecConstantTwoIntGraphicsCase local_808;
  SpecConstantTwoIntGraphicsCase local_7c0;
  SpecConstantTwoIntGraphicsCase local_778;
  SpecConstantTwoIntGraphicsCase local_730;
  SpecConstantTwoIntGraphicsCase local_6e8;
  SpecConstantTwoIntGraphicsCase local_6a0;
  SpecConstantTwoIntGraphicsCase local_658;
  SpecConstantTwoIntGraphicsCase local_610;
  SpecConstantTwoIntGraphicsCase local_5c8;
  SpecConstantTwoIntGraphicsCase local_580;
  SpecConstantTwoIntGraphicsCase local_538;
  SpecConstantTwoIntGraphicsCase local_4f0;
  SpecConstantTwoIntGraphicsCase local_4a8;
  SpecConstantTwoIntGraphicsCase local_460;
  char acStack_418 [8];
  char selectFalseUsingSc [39];
  char acStack_3e8 [8];
  char selectTrueUsingSc [39];
  char local_3b8 [8];
  char addZeroToSc [28];
  RGBA local_394;
  RGBA local_390;
  RGBA local_38c;
  RGBA local_388;
  RGBA local_384;
  RGBA local_380;
  RGBA local_37c;
  RGBA local_378;
  RGBA local_374;
  RGBA local_370;
  RGBA local_36c;
  RGBA local_368;
  RGBA local_364;
  RGBA local_360;
  RGBA local_35c;
  char local_358 [8];
  char function1 [505];
  char typesAndConstants1 [134];
  char acStack_c8 [8];
  char decorations1 [55];
  RGBA local_88;
  deUint32 local_84;
  RGBA outputColors2 [4];
  RGBA outputColors1 [4];
  RGBA outputColors0 [4];
  RGBA inputColors [4];
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  cases;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"opspecconstantop","Test the OpSpecConstantOp instruction");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             ((long)&cases.
                     super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar2
            );
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::vector((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
            *)(inputColors + 2));
  local_18c8 = outputColors0 + 2;
  do {
    tcu::RGBA::RGBA(local_18c8);
    local_18c8 = local_18c8 + 1;
  } while (local_18c8 != inputColors + 2);
  local_18e0 = outputColors1 + 2;
  do {
    tcu::RGBA::RGBA(local_18e0);
    local_18e0 = local_18e0 + 1;
  } while (local_18e0 != outputColors0 + 2);
  local_18f8 = outputColors2 + 2;
  do {
    tcu::RGBA::RGBA(local_18f8);
    local_18f8 = local_18f8 + 1;
  } while (local_18f8 != outputColors1 + 2);
  local_1910 = &local_88;
  do {
    tcu::RGBA::RGBA(local_1910);
    local_1910 = local_1910 + 1;
  } while (local_1910 != outputColors2 + 2);
  builtin_strncpy(decorations1,"te %sc_0  SpecId 0\nOpDecorate %sc_1  SpecId 1\n",0x2f);
  builtin_strncpy(acStack_c8,"OpDecora",8);
  memcpy(function1 + 0x1f8,
         "%sc_0      = OpSpecConstant${SC_DEF0}\n%sc_1      = OpSpecConstant${SC_DEF1}\n%sc_op     = OpSpecConstantOp ${SC_RESULT_TYPE} ${SC_OP}\n"
         ,0x86);
  memcpy(local_358,
         "%test_code = OpFunction %v4f32 None %v4f32_function\n%param     = OpFunctionParameter %v4f32\n%label     = OpLabel\n%result    = OpVariable %fp_v4f32 Function\n             OpStore %result %param\n%gen       = ${GEN_RESULT}\n%index     = OpIAdd %i32 %gen %c_i32_1\n%loc       = OpAccessChain %fp_f32 %result %index\n%val       = OpLoad %f32 %loc\n%add       = OpFAdd %f32 %val %c_f32_0_5\n             OpStore %loc %add\n%ret       = OpLoad %v4f32 %result\n             OpReturnValue %ret\n             OpFunctionEnd\n"
         ,0x1f9);
  tcu::RGBA::RGBA(&local_35c,0x7f,0x7f,0x7f,0xff);
  outputColors0[2].m_value = local_35c.m_value;
  tcu::RGBA::RGBA(&local_360,0x7f,0,0,0xff);
  outputColors0[3].m_value = local_360.m_value;
  tcu::RGBA::RGBA(&local_364,0,0x7f,0,0xff);
  inputColors[0].m_value = local_364.m_value;
  tcu::RGBA::RGBA(&local_368,0,0,0x7f,0xff);
  inputColors[1].m_value = local_368.m_value;
  tcu::RGBA::RGBA(&local_36c,0xff,0x7f,0x7f,0xff);
  outputColors1[2].m_value = local_36c.m_value;
  tcu::RGBA::RGBA(&local_370,0xff,0,0,0xff);
  outputColors1[3].m_value = local_370.m_value;
  tcu::RGBA::RGBA(&local_374,0x80,0x7f,0,0xff);
  outputColors0[0].m_value = local_374.m_value;
  tcu::RGBA::RGBA(&local_378,0x80,0,0x7f,0xff);
  outputColors0[1].m_value = local_378.m_value;
  tcu::RGBA::RGBA(&local_37c,0x7f,0xff,0x7f,0xff);
  outputColors2[2].m_value = local_37c.m_value;
  tcu::RGBA::RGBA(&local_380,0x7f,0x80,0,0xff);
  outputColors2[3].m_value = local_380.m_value;
  tcu::RGBA::RGBA(&local_384,0,0xff,0,0xff);
  outputColors1[0].m_value = local_384.m_value;
  tcu::RGBA::RGBA(&local_388,0,0x80,0x7f,0xff);
  outputColors1[1].m_value = local_388.m_value;
  tcu::RGBA::RGBA(&local_38c,0x7f,0x7f,0xff,0xff);
  local_88.m_value = local_38c.m_value;
  tcu::RGBA::RGBA(&local_390,0x7f,0,0x80,0xff);
  local_84 = local_390.m_value;
  tcu::RGBA::RGBA(&local_394,0,0x7f,0x80,0xff);
  outputColors2[0].m_value = local_394.m_value;
  tcu::RGBA::RGBA((RGBA *)(addZeroToSc + 0x18),0,0,0xff,0xff);
  outputColors2[1].m_value._0_1_ = addZeroToSc[0x18];
  outputColors2[1].m_value._1_1_ = addZeroToSc[0x19];
  outputColors2[1].m_value._2_1_ = addZeroToSc[0x1a];
  outputColors2[1].m_value._3_1_ = addZeroToSc[0x1b];
  builtin_strncpy(addZeroToSc + 8,"32_0 %sc_op",0xc);
  builtin_strncpy(local_3b8,"OpIAdd %",8);
  builtin_strncpy(addZeroToSc,"i32 %c_i",8);
  builtin_strncpy(selectTrueUsingSc + 8,"c_op %c_i32_1 %c_i32_0",0x17);
  builtin_strncpy(acStack_3e8,"OpSelect",8);
  builtin_strncpy(selectTrueUsingSc," %i32 %s",8);
  builtin_strncpy(selectFalseUsingSc + 8,"c_op %c_i32_0 %c_i32_1",0x17);
  builtin_strncpy(acStack_418,"OpSelect",8);
  builtin_strncpy(selectFalseUsingSc," %i32 %s",8);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_460,"iadd"," %i32 0"," %i32 0","%i32","IAdd                 %sc_0 %sc_1",0x13,
             -0x14,local_3b8,(RGBA (*) [4])(outputColors1 + 2));
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_460);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_4a8,"isub"," %i32 0"," %i32 0","%i32","ISub                 %sc_0 %sc_1",0x13,
             0x14,local_3b8,(RGBA (*) [4])(outputColors1 + 2));
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_4a8);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_4f0,"imul"," %i32 0"," %i32 0","%i32","IMul                 %sc_0 %sc_1",-1,-1,
             local_3b8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_4f0);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_538,"sdiv"," %i32 0"," %i32 0","%i32","SDiv                 %sc_0 %sc_1",-0x7e,
             0x7e,local_3b8,(RGBA (*) [4])(outputColors1 + 2));
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_538);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_580,"udiv"," %i32 0"," %i32 0","%i32","UDiv                 %sc_0 %sc_1",0x7e,
             0x7e,local_3b8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_580);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_5c8,"srem"," %i32 0"," %i32 0","%i32","SRem                 %sc_0 %sc_1",3,2,
             local_3b8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_5c8);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_610,"smod"," %i32 0"," %i32 0","%i32","SMod                 %sc_0 %sc_1",3,2,
             local_3b8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_610);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_658,"umod"," %i32 0"," %i32 0","%i32","UMod                 %sc_0 %sc_1",0x3e9,
             500,local_3b8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_658);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_6a0,"bitwiseand"," %i32 0"," %i32 0","%i32","BitwiseAnd           %sc_0 %sc_1",
             0x33,0xd,local_3b8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_6a0);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_6e8,"bitwiseor"," %i32 0"," %i32 0","%i32","BitwiseOr            %sc_0 %sc_1",0,
             1,local_3b8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_6e8);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_730,"bitwisexor"," %i32 0"," %i32 0","%i32","BitwiseXor           %sc_0 %sc_1",
             0x2e,0x2f,local_3b8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_730);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_778,"shiftrightlogical"," %i32 0"," %i32 0","%i32",
             "ShiftRightLogical    %sc_0 %sc_1",2,1,local_3b8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_778);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_7c0,"shiftrightarithmetic"," %i32 0"," %i32 0","%i32",
             "ShiftRightArithmetic %sc_0 %sc_1",-4,2,local_3b8,(RGBA (*) [4])(outputColors1 + 2));
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_7c0);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_808,"shiftleftlogical"," %i32 0"," %i32 0","%i32",
             "ShiftLeftLogical     %sc_0 %sc_1",1,0,local_3b8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_808);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_850,"slessthan"," %i32 0"," %i32 0","%bool","SLessThan            %sc_0 %sc_1",
             -0x14,-10,acStack_3e8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_850);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_898,"ulessthan"," %i32 0"," %i32 0","%bool","ULessThan            %sc_0 %sc_1",
             10,0x14,acStack_3e8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_898);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_8e0,"sgreaterthan"," %i32 0"," %i32 0","%bool",
             "SGreaterThan         %sc_0 %sc_1",-1000,0x32,acStack_418,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_8e0);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_928,"ugreaterthan"," %i32 0"," %i32 0","%bool",
             "UGreaterThan         %sc_0 %sc_1",10,5,acStack_3e8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_928);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_970,"slessthanequal"," %i32 0"," %i32 0","%bool",
             "SLessThanEqual       %sc_0 %sc_1",-10,-10,acStack_3e8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_970);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_9b8,"ulessthanequal"," %i32 0"," %i32 0","%bool",
             "ULessThanEqual       %sc_0 %sc_1",0x32,100,acStack_3e8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_9b8);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_a00,"sgreaterthanequal"," %i32 0"," %i32 0","%bool",
             "SGreaterThanEqual    %sc_0 %sc_1",-1000,0x32,acStack_418,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_a00);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_a48,"ugreaterthanequal"," %i32 0"," %i32 0","%bool",
             "UGreaterThanEqual    %sc_0 %sc_1",10,10,acStack_3e8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_a48);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_a90,"iequal"," %i32 0"," %i32 0","%bool","IEqual               %sc_0 %sc_1",0x2a
             ,0x18,acStack_418,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_a90);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_ad8,"logicaland","True %bool","True %bool","%bool",
             "LogicalAnd           %sc_0 %sc_1",0,1,acStack_418,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_ad8);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_b20,"logicalor","False %bool","False %bool","%bool",
             "LogicalOr            %sc_0 %sc_1",1,0,acStack_3e8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_b20);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_b68,"logicalequal","True %bool","True %bool","%bool",
             "LogicalEqual         %sc_0 %sc_1",0,1,acStack_418,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_b68);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_bb0,"logicalnotequal","False %bool","False %bool","%bool",
             "LogicalNotEqual      %sc_0 %sc_1",1,0,acStack_3e8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_bb0);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_bf8,"snegate"," %i32 0"," %i32 0","%i32","SNegate              %sc_0",-1,0,
             local_3b8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_bf8);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_c40,"not"," %i32 0"," %i32 0","%i32","Not                  %sc_0",-2,0,local_3b8
             ,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_c40);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            (&local_c88,"logicalnot","False %bool","False %bool","%bool",
             "LogicalNot           %sc_0",1,0,acStack_418,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),&local_c88);
  SpecConstantTwoIntGraphicsCase::SpecConstantTwoIntGraphicsCase
            ((SpecConstantTwoIntGraphicsCase *)&caseNdx,"select","False %bool"," %i32 0","%i32",
             "Select               %sc_0 %sc_1 %c_i32_0",1,1,local_3b8,(RGBA (*) [4])&local_88);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::push_back((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
               *)(inputColors + 2),(value_type *)&caseNdx);
  specializations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  while( true ) {
    sVar3 = std::
            vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
            ::size((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                    *)(inputColors + 2));
    if (sVar3 <= specializations._M_t._M_impl.super__Rb_tree_header._M_node_count) break;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&fragments_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&specConstants_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_d50);
    pvVar4 = std::
             vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ::operator[]((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                           *)(inputColors + 2),
                          specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pcVar1 = pvVar4->scDefinition0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d70,"SC_DEF0",&local_d71);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fragments_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_d70);
    std::__cxx11::string::operator=((string *)pmVar5,pcVar1);
    std::__cxx11::string::~string((string *)&local_d70);
    std::allocator<char>::~allocator(&local_d71);
    pvVar4 = std::
             vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ::operator[]((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                           *)(inputColors + 2),
                          specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pcVar1 = pvVar4->scDefinition1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d98,"SC_DEF1",&local_d99);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fragments_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_d98);
    std::__cxx11::string::operator=((string *)pmVar5,pcVar1);
    std::__cxx11::string::~string((string *)&local_d98);
    std::allocator<char>::~allocator(&local_d99);
    pvVar4 = std::
             vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ::operator[]((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                           *)(inputColors + 2),
                          specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pcVar1 = pvVar4->scResultType;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_dc0,"SC_RESULT_TYPE",&local_dc1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fragments_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_dc0);
    std::__cxx11::string::operator=((string *)pmVar5,pcVar1);
    std::__cxx11::string::~string((string *)&local_dc0);
    std::allocator<char>::~allocator(&local_dc1);
    pvVar4 = std::
             vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ::operator[]((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                           *)(inputColors + 2),
                          specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pcVar1 = pvVar4->scOperation;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_de8,"SC_OP",&local_de9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fragments_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_de8);
    std::__cxx11::string::operator=((string *)pmVar5,pcVar1);
    std::__cxx11::string::~string((string *)&local_de8);
    std::allocator<char>::~allocator(&local_de9);
    pvVar4 = std::
             vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ::operator[]((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                           *)(inputColors + 2),
                          specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pcVar1 = pvVar4->resultOperation;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e10,"GEN_RESULT",&local_e11)
    ;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fragments_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_e10);
    std::__cxx11::string::operator=((string *)pmVar5,pcVar1);
    std::__cxx11::string::~string((string *)&local_e10);
    std::allocator<char>::~allocator(&local_e11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e78,acStack_c8,&local_e79);
    tcu::StringTemplate::StringTemplate(&local_e58,&local_e78);
    tcu::StringTemplate::specialize
              (&local_e38,&local_e58,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&fragments_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ea0,"decoration",&local_ea1)
    ;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&specConstants_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,&local_ea0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_e38);
    std::__cxx11::string::~string((string *)&local_ea0);
    std::allocator<char>::~allocator(&local_ea1);
    std::__cxx11::string::~string((string *)&local_e38);
    tcu::StringTemplate::~StringTemplate(&local_e58);
    std::__cxx11::string::~string((string *)&local_e78);
    std::allocator<char>::~allocator(&local_e79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f08,function1 + 0x1f8,&local_f09);
    tcu::StringTemplate::StringTemplate(&local_ee8,&local_f08);
    tcu::StringTemplate::specialize
              (&local_ec8,&local_ee8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&fragments_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f30,"pre_main",&local_f31);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&specConstants_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,&local_f30);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_ec8);
    std::__cxx11::string::~string((string *)&local_f30);
    std::allocator<char>::~allocator(&local_f31);
    std::__cxx11::string::~string((string *)&local_ec8);
    tcu::StringTemplate::~StringTemplate(&local_ee8);
    std::__cxx11::string::~string((string *)&local_f08);
    std::allocator<char>::~allocator(&local_f09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f98,local_358,&local_f99);
    tcu::StringTemplate::StringTemplate(&local_f78,&local_f98);
    tcu::StringTemplate::specialize
              (&local_f58,&local_f78,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&fragments_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_fc0,"testfun",&local_fc1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&specConstants_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,&local_fc0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_f58);
    std::__cxx11::string::~string((string *)&local_fc0);
    std::allocator<char>::~allocator(&local_fc1);
    std::__cxx11::string::~string((string *)&local_f58);
    tcu::StringTemplate::~StringTemplate(&local_f78);
    std::__cxx11::string::~string((string *)&local_f98);
    std::allocator<char>::~allocator(&local_f99);
    pvVar4 = std::
             vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ::operator[]((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                           *)(inputColors + 2),
                          specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_d50,&pvVar4->scActualValue0);
    pvVar4 = std::
             vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ::operator[]((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                           *)(inputColors + 2),
                          specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_d50,&pvVar4->scActualValue1);
    pvVar4 = std::
             vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ::operator[]((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                           *)(inputColors + 2),
                          specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pcVar1 = pvVar4->caseName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_fe8,pcVar1,&local_fe9);
    pvVar4 = std::
             vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ::operator[]((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                           *)(inputColors + 2),
                          specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20
                );
    std::__cxx11::string::string((string *)(decorations2 + 0x50));
    createTestsForAllStages
              (&local_fe8,(RGBA (*) [4])(outputColors0 + 2),&pvVar4->expectedColors,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&specConstants_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
               (vector<int,_std::allocator<int>_> *)local_d50,pTVar2,QP_TEST_RESULT_FAIL,
               (string *)(decorations2 + 0x50));
    std::__cxx11::string::~string((string *)(decorations2 + 0x50));
    std::__cxx11::string::~string((string *)&local_fe8);
    std::allocator<char>::~allocator(&local_fe9);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_d50);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&specConstants_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&fragments_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    specializations._M_t._M_impl.super__Rb_tree_header._M_node_count =
         specializations._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
  }
  builtin_strncpy(decorations2,
                  "te %sc_0  SpecId 0\nOpDecorate %sc_1  SpecId 1\nOpDecorate %sc_2  SpecId 2\n",
                  0x4a);
  typesAndConstants2[0x578] = 'O';
  typesAndConstants2[0x579] = 'p';
  cStack_1066 = 'D';
  cStack_1065 = 'e';
  cStack_1064 = 'c';
  cStack_1063 = 'o';
  cStack_1062 = 'r';
  cStack_1061 = 'a';
  memcpy(function2 + 0x1b8,
         "%v3i32       = OpTypeVector %i32 3\n%vec3_0      = OpConstantComposite %v3i32 %c_i32_0 %c_i32_0 %c_i32_0\n%vec3_undef  = OpUndef %v3i32\n%sc_0        = OpSpecConstant %i32 0\n%sc_1        = OpSpecConstant %i32 0\n%sc_2        = OpSpecConstant %i32 0\n%sc_vec3_0   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_0        %vec3_0      0\n%sc_vec3_1   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_1        %vec3_0      1\n%sc_vec3_2   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_2        %vec3_0      2\n%sc_vec3_0_s = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_0   %vec3_undef  0          0xFFFFFFFF 2\n%sc_vec3_1_s = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_1   %vec3_undef  0xFFFFFFFF 1          0\n%sc_vec3_2_s = OpSpecConstantOp %v3i32 VectorShuffle    %vec3_undef  %sc_vec3_2   5          0xFFFFFFFF 5\n%sc_vec3_01  = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_0_s %sc_vec3_1_s 1 0 4\n%sc_vec3_012 = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_01  %sc_vec3_2_s 5 1 2\n%sc_ext_0    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              0\n%sc_ext_1    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              1\n%sc_ext_2    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              2\n%sc_sub      = OpSpecConstantOp %i32   ISub             %sc_ext_0    %sc_ext_1\n%sc_final    = OpSpecConstantOp %i32   IMul             %sc_sub      %sc_ext_2\n"
         ,0x57a);
  memcpy(&fragments._M_t._M_impl.super__Rb_tree_header._M_node_count,
         "%test_code = OpFunction %v4f32 None %v4f32_function\n%param     = OpFunctionParameter %v4f32\n%label     = OpLabel\n%result    = OpVariable %fp_v4f32 Function\n             OpStore %result %param\n%loc       = OpAccessChain %fp_f32 %result %sc_final\n%val       = OpLoad %f32 %loc\n%add       = OpFAdd %f32 %val %c_f32_0_5\n             OpStore %loc %add\n%ret       = OpLoad %v4f32 %result\n             OpReturnValue %ret\n             OpFunctionEnd\n"
         ,0x1ba);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_17f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1810,"decoration",&local_1811)
  ;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,&local_1810);
  std::__cxx11::string::operator=((string *)pmVar5,typesAndConstants2 + 0x578);
  std::__cxx11::string::~string((string *)&local_1810);
  std::allocator<char>::~allocator(&local_1811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1838,"pre_main",&local_1839);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,&local_1838);
  std::__cxx11::string::operator=((string *)pmVar5,function2 + 0x1b8);
  std::__cxx11::string::~string((string *)&local_1838);
  std::allocator<char>::~allocator(&local_1839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1860,"testfun",&local_1861);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,&local_1860);
  std::__cxx11::string::operator=
            ((string *)pmVar5,(char *)&fragments._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_1860);
  std::allocator<char>::~allocator(&local_1861);
  local_1870[2] = 0xddd5;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_17f0,local_1870 + 2);
  local_1870[1] = 0xfffffffe;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_17f0,local_1870 + 1);
  local_1870[0] = 0xddd4;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_17f0,local_1870);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1890,"vector_related",&local_1891);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_20);
  std::__cxx11::string::string((string *)&local_18b8);
  createTestsForAllStages
            (&local_1890,(RGBA (*) [4])(outputColors0 + 2),(RGBA (*) [4])&local_88,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)local_17f0,pTVar2,QP_TEST_RESULT_FAIL,&local_18b8)
  ;
  std::__cxx11::string::~string((string *)&local_18b8);
  std::__cxx11::string::~string((string *)&local_1890);
  std::allocator<char>::~allocator(&local_1891);
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_17f0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ::~vector((vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             *)(inputColors + 2));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createSpecConstantTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group				(new tcu::TestCaseGroup(testCtx, "opspecconstantop", "Test the OpSpecConstantOp instruction"));
	vector<SpecConstantTwoIntGraphicsCase>	cases;
	RGBA							inputColors[4];
	RGBA							outputColors0[4];
	RGBA							outputColors1[4];
	RGBA							outputColors2[4];

	const char	decorations1[]			=
		"OpDecorate %sc_0  SpecId 0\n"
		"OpDecorate %sc_1  SpecId 1\n";

	const char	typesAndConstants1[]	=
		"%sc_0      = OpSpecConstant${SC_DEF0}\n"
		"%sc_1      = OpSpecConstant${SC_DEF1}\n"
		"%sc_op     = OpSpecConstantOp ${SC_RESULT_TYPE} ${SC_OP}\n";

	const char	function1[]				=
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param     = OpFunctionParameter %v4f32\n"
		"%label     = OpLabel\n"
		"%result    = OpVariable %fp_v4f32 Function\n"
		"             OpStore %result %param\n"
		"%gen       = ${GEN_RESULT}\n"
		"%index     = OpIAdd %i32 %gen %c_i32_1\n"
		"%loc       = OpAccessChain %fp_f32 %result %index\n"
		"%val       = OpLoad %f32 %loc\n"
		"%add       = OpFAdd %f32 %val %c_f32_0_5\n"
		"             OpStore %loc %add\n"
		"%ret       = OpLoad %v4f32 %result\n"
		"             OpReturnValue %ret\n"
		"             OpFunctionEnd\n";

	inputColors[0] = RGBA(127, 127, 127, 255);
	inputColors[1] = RGBA(127, 0,   0,   255);
	inputColors[2] = RGBA(0,   127, 0,   255);
	inputColors[3] = RGBA(0,   0,   127, 255);

	// Derived from inputColors[x] by adding 128 to inputColors[x][0].
	outputColors0[0] = RGBA(255, 127, 127, 255);
	outputColors0[1] = RGBA(255, 0,   0,   255);
	outputColors0[2] = RGBA(128, 127, 0,   255);
	outputColors0[3] = RGBA(128, 0,   127, 255);

	// Derived from inputColors[x] by adding 128 to inputColors[x][1].
	outputColors1[0] = RGBA(127, 255, 127, 255);
	outputColors1[1] = RGBA(127, 128, 0,   255);
	outputColors1[2] = RGBA(0,   255, 0,   255);
	outputColors1[3] = RGBA(0,   128, 127, 255);

	// Derived from inputColors[x] by adding 128 to inputColors[x][2].
	outputColors2[0] = RGBA(127, 127, 255, 255);
	outputColors2[1] = RGBA(127, 0,   128, 255);
	outputColors2[2] = RGBA(0,   127, 128, 255);
	outputColors2[3] = RGBA(0,   0,   255, 255);

	const char addZeroToSc[]		= "OpIAdd %i32 %c_i32_0 %sc_op";
	const char selectTrueUsingSc[]	= "OpSelect %i32 %sc_op %c_i32_1 %c_i32_0";
	const char selectFalseUsingSc[]	= "OpSelect %i32 %sc_op %c_i32_0 %c_i32_1";

	cases.push_back(SpecConstantTwoIntGraphicsCase("iadd",					" %i32 0",		" %i32 0",		"%i32",		"IAdd                 %sc_0 %sc_1",				19,		-20,	addZeroToSc,		outputColors0));
	cases.push_back(SpecConstantTwoIntGraphicsCase("isub",					" %i32 0",		" %i32 0",		"%i32",		"ISub                 %sc_0 %sc_1",				19,		20,		addZeroToSc,		outputColors0));
	cases.push_back(SpecConstantTwoIntGraphicsCase("imul",					" %i32 0",		" %i32 0",		"%i32",		"IMul                 %sc_0 %sc_1",				-1,		-1,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("sdiv",					" %i32 0",		" %i32 0",		"%i32",		"SDiv                 %sc_0 %sc_1",				-126,	126,	addZeroToSc,		outputColors0));
	cases.push_back(SpecConstantTwoIntGraphicsCase("udiv",					" %i32 0",		" %i32 0",		"%i32",		"UDiv                 %sc_0 %sc_1",				126,	126,	addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("srem",					" %i32 0",		" %i32 0",		"%i32",		"SRem                 %sc_0 %sc_1",				3,		2,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("smod",					" %i32 0",		" %i32 0",		"%i32",		"SMod                 %sc_0 %sc_1",				3,		2,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("umod",					" %i32 0",		" %i32 0",		"%i32",		"UMod                 %sc_0 %sc_1",				1001,	500,	addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("bitwiseand",			" %i32 0",		" %i32 0",		"%i32",		"BitwiseAnd           %sc_0 %sc_1",				0x33,	0x0d,	addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("bitwiseor",				" %i32 0",		" %i32 0",		"%i32",		"BitwiseOr            %sc_0 %sc_1",				0,		1,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("bitwisexor",			" %i32 0",		" %i32 0",		"%i32",		"BitwiseXor           %sc_0 %sc_1",				0x2e,	0x2f,	addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("shiftrightlogical",		" %i32 0",		" %i32 0",		"%i32",		"ShiftRightLogical    %sc_0 %sc_1",				2,		1,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("shiftrightarithmetic",	" %i32 0",		" %i32 0",		"%i32",		"ShiftRightArithmetic %sc_0 %sc_1",				-4,		2,		addZeroToSc,		outputColors0));
	cases.push_back(SpecConstantTwoIntGraphicsCase("shiftleftlogical",		" %i32 0",		" %i32 0",		"%i32",		"ShiftLeftLogical     %sc_0 %sc_1",				1,		0,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("slessthan",				" %i32 0",		" %i32 0",		"%bool",	"SLessThan            %sc_0 %sc_1",				-20,	-10,	selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("ulessthan",				" %i32 0",		" %i32 0",		"%bool",	"ULessThan            %sc_0 %sc_1",				10,		20,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("sgreaterthan",			" %i32 0",		" %i32 0",		"%bool",	"SGreaterThan         %sc_0 %sc_1",				-1000,	50,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("ugreaterthan",			" %i32 0",		" %i32 0",		"%bool",	"UGreaterThan         %sc_0 %sc_1",				10,		5,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("slessthanequal",		" %i32 0",		" %i32 0",		"%bool",	"SLessThanEqual       %sc_0 %sc_1",				-10,	-10,	selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("ulessthanequal",		" %i32 0",		" %i32 0",		"%bool",	"ULessThanEqual       %sc_0 %sc_1",				50,		100,	selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("sgreaterthanequal",		" %i32 0",		" %i32 0",		"%bool",	"SGreaterThanEqual    %sc_0 %sc_1",				-1000,	50,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("ugreaterthanequal",		" %i32 0",		" %i32 0",		"%bool",	"UGreaterThanEqual    %sc_0 %sc_1",				10,		10,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("iequal",				" %i32 0",		" %i32 0",		"%bool",	"IEqual               %sc_0 %sc_1",				42,		24,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicaland",			"True %bool",	"True %bool",	"%bool",	"LogicalAnd           %sc_0 %sc_1",				0,		1,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicalor",				"False %bool",	"False %bool",	"%bool",	"LogicalOr            %sc_0 %sc_1",				1,		0,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicalequal",			"True %bool",	"True %bool",	"%bool",	"LogicalEqual         %sc_0 %sc_1",				0,		1,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicalnotequal",		"False %bool",	"False %bool",	"%bool",	"LogicalNotEqual      %sc_0 %sc_1",				1,		0,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("snegate",				" %i32 0",		" %i32 0",		"%i32",		"SNegate              %sc_0",					-1,		0,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("not",					" %i32 0",		" %i32 0",		"%i32",		"Not                  %sc_0",					-2,		0,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicalnot",			"False %bool",	"False %bool",	"%bool",	"LogicalNot           %sc_0",					1,		0,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("select",				"False %bool",	" %i32 0",		"%i32",		"Select               %sc_0 %sc_1 %c_i32_0",	1,		1,		addZeroToSc,		outputColors2));
	// OpSConvert, OpFConvert: these two instructions involve ints/floats of different bitwidths.
	// \todo[2015-12-1 antiagainst] OpQuantizeToF16

	for (size_t caseNdx = 0; caseNdx < cases.size(); ++caseNdx)
	{
		map<string, string>	specializations;
		map<string, string>	fragments;
		vector<deInt32>		specConstants;

		specializations["SC_DEF0"]			= cases[caseNdx].scDefinition0;
		specializations["SC_DEF1"]			= cases[caseNdx].scDefinition1;
		specializations["SC_RESULT_TYPE"]	= cases[caseNdx].scResultType;
		specializations["SC_OP"]			= cases[caseNdx].scOperation;
		specializations["GEN_RESULT"]		= cases[caseNdx].resultOperation;

		fragments["decoration"]				= tcu::StringTemplate(decorations1).specialize(specializations);
		fragments["pre_main"]				= tcu::StringTemplate(typesAndConstants1).specialize(specializations);
		fragments["testfun"]				= tcu::StringTemplate(function1).specialize(specializations);

		specConstants.push_back(cases[caseNdx].scActualValue0);
		specConstants.push_back(cases[caseNdx].scActualValue1);

		createTestsForAllStages(cases[caseNdx].caseName, inputColors, cases[caseNdx].expectedColors, fragments, specConstants, group.get());
	}

	const char	decorations2[]			=
		"OpDecorate %sc_0  SpecId 0\n"
		"OpDecorate %sc_1  SpecId 1\n"
		"OpDecorate %sc_2  SpecId 2\n";

	const char	typesAndConstants2[]	=
		"%v3i32       = OpTypeVector %i32 3\n"
		"%vec3_0      = OpConstantComposite %v3i32 %c_i32_0 %c_i32_0 %c_i32_0\n"
		"%vec3_undef  = OpUndef %v3i32\n"

		"%sc_0        = OpSpecConstant %i32 0\n"
		"%sc_1        = OpSpecConstant %i32 0\n"
		"%sc_2        = OpSpecConstant %i32 0\n"
		"%sc_vec3_0   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_0        %vec3_0      0\n"							// (sc_0, 0,    0)
		"%sc_vec3_1   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_1        %vec3_0      1\n"							// (0,    sc_1, 0)
		"%sc_vec3_2   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_2        %vec3_0      2\n"							// (0,    0,    sc_2)
		"%sc_vec3_0_s = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_0   %vec3_undef  0          0xFFFFFFFF 2\n"	// (sc_0, ???,  0)
		"%sc_vec3_1_s = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_1   %vec3_undef  0xFFFFFFFF 1          0\n"	// (???,  sc_1, 0)
		"%sc_vec3_2_s = OpSpecConstantOp %v3i32 VectorShuffle    %vec3_undef  %sc_vec3_2   5          0xFFFFFFFF 5\n"	// (sc_2, ???,  sc_2)
		"%sc_vec3_01  = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_0_s %sc_vec3_1_s 1 0 4\n"						// (0,    sc_0, sc_1)
		"%sc_vec3_012 = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_01  %sc_vec3_2_s 5 1 2\n"						// (sc_2, sc_0, sc_1)
		"%sc_ext_0    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              0\n"							// sc_2
		"%sc_ext_1    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              1\n"							// sc_0
		"%sc_ext_2    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              2\n"							// sc_1
		"%sc_sub      = OpSpecConstantOp %i32   ISub             %sc_ext_0    %sc_ext_1\n"								// (sc_2 - sc_0)
		"%sc_final    = OpSpecConstantOp %i32   IMul             %sc_sub      %sc_ext_2\n";								// (sc_2 - sc_0) * sc_1

	const char	function2[]				=
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param     = OpFunctionParameter %v4f32\n"
		"%label     = OpLabel\n"
		"%result    = OpVariable %fp_v4f32 Function\n"
		"             OpStore %result %param\n"
		"%loc       = OpAccessChain %fp_f32 %result %sc_final\n"
		"%val       = OpLoad %f32 %loc\n"
		"%add       = OpFAdd %f32 %val %c_f32_0_5\n"
		"             OpStore %loc %add\n"
		"%ret       = OpLoad %v4f32 %result\n"
		"             OpReturnValue %ret\n"
		"             OpFunctionEnd\n";

	map<string, string>	fragments;
	vector<deInt32>		specConstants;

	fragments["decoration"]	= decorations2;
	fragments["pre_main"]	= typesAndConstants2;
	fragments["testfun"]	= function2;

	specConstants.push_back(56789);
	specConstants.push_back(-2);
	specConstants.push_back(56788);

	createTestsForAllStages("vector_related", inputColors, outputColors2, fragments, specConstants, group.get());

	return group.release();
}